

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O1

void soa_chunk_init(soa_chunk_t *chunk,size_t blockSize,uchar numBlocks)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar uVar3;
  undefined7 in_register_00000011;
  size_t __size;
  
  __size = (CONCAT71(in_register_00000011,numBlocks) & 0xffffffff) * blockSize;
  puVar1 = (uchar *)malloc(__size);
  chunk->blockData = puVar1;
  if (puVar1 != (uchar *)0x0) {
    chunk->firstBlock = '\0';
    chunk->freeBlocks = numBlocks;
    puVar2 = puVar1;
    if (numBlocks != '\0') {
      uVar3 = '\x01';
      do {
        *puVar2 = uVar3;
        puVar2 = puVar2 + blockSize;
        uVar3 = uVar3 + '\x01';
      } while ((uchar)(uVar3 - numBlocks) != '\x01');
    }
    if (puVar2 != puVar1 + __size) {
      __assert_fail("p==chunk->blockData+(blockSize * numBlocks)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                    ,0x1e,"void soa_chunk_init(soa_chunk_t *, size_t, unsigned char)");
    }
  }
  return;
}

Assistant:

void soa_chunk_init( soa_chunk_t *chunk, size_t blockSize, unsigned char numBlocks )
{
  unsigned char i;
  unsigned char *p;
  chunk->blockData = (unsigned char*) malloc(blockSize * numBlocks);
  if(chunk->blockData == 0) return;
  chunk->firstBlock = 0;
  chunk->freeBlocks = numBlocks;
  for(i=0, p=chunk->blockData; i<numBlocks; p+=blockSize)
  {
    *p = ++i;
  }
  assert(p==chunk->blockData+(blockSize * numBlocks));
}